

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

uint AnalyzeAlignment(ExpressionContext *ctx,SynAlign *syntax)

{
  ExprBase *pEVar1;
  char *msg;
  uint uVar2;
  _func_int **unaff_R12;
  
  if (syntax->value == (SynBase *)0x0) {
    return 1;
  }
  pEVar1 = AnalyzeExpression(ctx,syntax->value);
  if ((pEVar1->type != (TypeBase *)0x0) && (pEVar1->type->typeID == 0)) {
    return 0;
  }
  pEVar1 = CreateCast(ctx,&syntax->super_SynBase,pEVar1,ctx->typeLong,false);
  pEVar1 = anon_unknown.dwarf_11255e::EvaluateExpression(ctx,&syntax->super_SynBase,pEVar1);
  if ((pEVar1 == (ExprBase *)0x0) || (pEVar1->typeID != 6)) {
    pEVar1 = (ExprBase *)0x0;
  }
  if (pEVar1 != (ExprBase *)0x0) {
    unaff_R12 = pEVar1[1]._vptr_ExprBase;
    if ((long)unaff_R12 < 0x11) {
      if (((ulong)unaff_R12 & (long)unaff_R12 - 1U) == 0) goto LAB_001ee988;
      msg = "ERROR: alignment must be power of two";
    }
    else {
      msg = "ERROR: alignment must be less than 16 bytes";
    }
    unaff_R12 = (_func_int **)0x0;
    anon_unknown.dwarf_11255e::Report(ctx,&syntax->super_SynBase,msg);
  }
LAB_001ee988:
  uVar2 = (uint)unaff_R12;
  if (pEVar1 == (ExprBase *)0x0) {
    uVar2 = 0;
    anon_unknown.dwarf_11255e::Report
              (ctx,&syntax->super_SynBase,"ERROR: alignment must be a constant expression");
  }
  return uVar2;
}

Assistant:

unsigned AnalyzeAlignment(ExpressionContext &ctx, SynAlign *syntax)
{
	// noalign
	if(!syntax->value)
		return 1;

	ExprBase *align = AnalyzeExpression(ctx, syntax->value);

	// Some info about aignment expression tree is lost
	if(isType<TypeError>(align->type))
		return 0;

	if(ExprIntegerLiteral *alignValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, syntax, align, ctx.typeLong, false))))
	{
		if(alignValue->value > 16)
		{
			Report(ctx, syntax, "ERROR: alignment must be less than 16 bytes");

			return 0;
		}

		if(alignValue->value & (alignValue->value - 1))
		{
			Report(ctx, syntax, "ERROR: alignment must be power of two");

			return 0;
		}

		return unsigned(alignValue->value);
	}

	Report(ctx, syntax, "ERROR: alignment must be a constant expression");

	return 0;
}